

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int disas_neon_ls_insn(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  target_ulong tVar1;
  _Bool _Var2;
  uint32_t syn;
  uint reg_00;
  uint reg_01;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  MemOp mop;
  int iVar7;
  TCGv_i64 arg;
  TCGv_i32 pTVar8;
  TCGv_i32 pTVar9;
  long lVar10;
  long lVar11;
  sbyte sVar12;
  bool bVar13;
  uint32_t local_c8;
  TCGv_i32 index;
  TCGv_i32 base;
  int reg_idx;
  int idx;
  int a;
  int tt;
  int xs;
  TCGv_i64 tmp64;
  TCGv_i32 tmp2;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  MemOp endian;
  int mmu_idx;
  int vec_size;
  int n;
  int load;
  int reg;
  int size;
  int stride;
  int spacing;
  int interleave;
  int nregs;
  int op;
  int rm;
  int rn;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->fp_excp_el != 0) {
    tVar1 = s->pc_curr;
    syn = syn_simd_access_trap(1,0xe,false);
    gen_exception_insn(s,(uint32_t)tVar1,1,syn,s->fp_excp_el);
    return 0;
  }
  if ((s->vfp_enabled & 1U) == 0) {
    return 1;
  }
  _Var2 = isar_feature_aa32_simd_r32(s->isar);
  if (_Var2) {
    rm = insn >> 0xc & 0xf | insn >> 0x12 & 0x10;
  }
  else {
    if ((insn & 0x400000) != 0) {
      return 1;
    }
    rm = insn >> 0xc & 0xf;
  }
  reg_00 = insn >> 0x10 & 0xf;
  reg_01 = insn & 0xf;
  bVar13 = (insn & 0x200000) == 0;
  addr._4_4_ = s->be_data;
  iVar3 = get_mem_index(s);
  if ((insn & 0x800000) == 0) {
    uVar4 = insn >> 8 & 0xf;
    load = insn >> 6 & 3;
    if (10 < uVar4) {
      return 1;
    }
    uVar5 = insn >> 8 & 0xc;
    if (uVar5 == 4) {
      if ((insn >> 5 & 1) == 1) {
        return 1;
      }
    }
    else if ((uVar5 == 8) && ((insn >> 4 & 3) == 3)) {
      return 1;
    }
    iVar7 = neon_ls_element_type[(int)uVar4].nregs;
    uVar5 = neon_ls_element_type[(int)uVar4].interleave;
    uVar4 = neon_ls_element_type[(int)uVar4].spacing;
    if ((load == 3) && ((uVar5 | uVar4) != 1)) {
      return 1;
    }
    if (load == 0) {
      addr._4_4_ = MO_8;
    }
    if ((uVar5 == 1) && (addr._4_4_ == MO_8)) {
      load = 3;
    }
    arg = tcg_temp_new_i64(tcg_ctx_00);
    pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
    pTVar9 = tcg_const_i32_aarch64(tcg_ctx_00,1 << (sbyte)load);
    load_reg_var(s,pTVar8,reg_00);
    for (n = 0; n < iVar7; n = n + 1) {
      for (mmu_idx = 0; mmu_idx < 8 >> (sbyte)load; mmu_idx = mmu_idx + 1) {
        for (a = 0; a < (int)uVar5; a = a + 1) {
          iVar6 = rm + n + uVar4 * a;
          if (bVar13) {
            neon_load_element64(tcg_ctx_00,arg,iVar6,mmu_idx,load);
            gen_aa32_st_i64(s,arg,pTVar8,iVar3,addr._4_4_ | load);
          }
          else {
            gen_aa32_ld_i64(s,arg,pTVar8,iVar3,addr._4_4_ | load);
            neon_store_element64(tcg_ctx_00,iVar6,mmu_idx,load,arg);
          }
          tcg_gen_add_i32(tcg_ctx_00,pTVar8,pTVar8,pTVar9);
        }
      }
    }
    tcg_temp_free_i32(tcg_ctx_00,pTVar8);
    tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    tcg_temp_free_i64(tcg_ctx_00,arg);
    reg = iVar7 * uVar5 * 8;
  }
  else {
    mop = insn >> 10 & MO_64;
    if (mop == MO_64) {
      uVar4 = insn >> 4 & 1;
      if (bVar13) {
        return 1;
      }
      load = insn >> 6 & 3;
      iVar3 = (insn >> 8 & 3) + 1;
      if (load == 3) {
        if ((iVar3 != 4) || (uVar4 == 0)) {
          return 1;
        }
        load = 2;
      }
      if (((iVar3 == 1) && (uVar4 == 1)) && (load == 0)) {
        return 1;
      }
      if ((iVar3 == 3) && (uVar4 == 1)) {
        return 1;
      }
      pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
      load_reg_var(s,pTVar8,reg_00);
      iVar7 = 1;
      if ((insn & 0x20) != 0) {
        iVar7 = 2;
      }
      if (iVar3 == 1) {
        local_c8 = iVar7 << 3;
      }
      else {
        local_c8 = 8;
      }
      pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
      for (n = 0; n < iVar3; n = n + 1) {
        iVar6 = get_mem_index(s);
        gen_aa32_ld_i32(s,pTVar9,pTVar8,iVar6,s->be_data | load);
        if (((rm & 1U) == 0) || (local_c8 != 0x10)) {
          lVar10 = neon_reg_offset(rm,0);
          tcg_gen_gvec_dup_i32_aarch64(tcg_ctx_00,load,(uint32_t)lVar10,local_c8,local_c8,pTVar9);
        }
        else {
          lVar10 = neon_reg_offset(rm,0);
          tcg_gen_gvec_dup_i32_aarch64(tcg_ctx_00,load,(uint32_t)lVar10,8,8,pTVar9);
          lVar10 = neon_reg_offset(rm + 1,0);
          lVar11 = neon_reg_offset(rm,0);
          tcg_gen_gvec_mov_aarch64(tcg_ctx_00,0,(uint32_t)lVar10,(uint32_t)lVar11,8,8);
        }
        tcg_gen_addi_i32_aarch64(tcg_ctx_00,pTVar8,pTVar8,1 << (sbyte)load);
        rm = iVar7 + rm;
      }
      tcg_temp_free_i32(tcg_ctx_00,pTVar9);
      tcg_temp_free_i32(tcg_ctx_00,pTVar8);
      reg = (1 << (sbyte)load) * iVar3;
    }
    else {
      uVar4 = insn >> 4;
      if (mop == MO_8) {
        base._4_4_ = insn >> 5 & 7;
        reg = 1;
      }
      else if (mop == MO_16) {
        base._4_4_ = insn >> 6 & 3;
        reg = 1;
        if ((insn & 0x20) != 0) {
          reg = 2;
        }
      }
      else {
        if (mop != MO_32) {
          abort();
        }
        base._4_4_ = insn >> 7 & 1;
        reg = 1;
        if ((insn & 0x40) != 0) {
          reg = 2;
        }
      }
      uVar5 = insn >> 8 & 3;
      sVar12 = (sbyte)mop;
      switch(uVar5) {
      case 0:
        if (((uVar4 & 0xf & 1 << sVar12) != 0) ||
           ((mop == MO_32 && (((uVar4 & 3) == 1 || ((uVar4 & 3) == 2)))))) {
          return 1;
        }
        break;
      case 2:
        if ((uVar4 & 1) != 0) {
          return 1;
        }
      case 1:
        if ((mop == MO_32) && ((uVar4 & 2) != 0)) {
          return 1;
        }
        break;
      case 3:
        if ((mop == MO_32) && ((uVar4 & 3) == 3)) {
          return 1;
        }
        break;
      default:
        abort();
      }
      if (0x1f < rm + reg * uVar5) {
        return 1;
      }
      pTVar8 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
      load_reg_var(s,pTVar9,reg_00);
      for (n = 0; n < (int)(uVar5 + 1); n = n + 1) {
        if (bVar13) {
          neon_load_element(tcg_ctx_00,pTVar8,rm,base._4_4_,mop);
          iVar3 = get_mem_index(s);
          gen_aa32_st_i32(s,pTVar8,pTVar9,iVar3,s->be_data | mop);
        }
        else {
          iVar3 = get_mem_index(s);
          gen_aa32_ld_i32(s,pTVar8,pTVar9,iVar3,s->be_data | mop);
          neon_store_element(tcg_ctx_00,rm,base._4_4_,mop,pTVar8);
        }
        rm = reg + rm;
        tcg_gen_addi_i32_aarch64(tcg_ctx_00,pTVar9,pTVar9,1 << sVar12);
      }
      tcg_temp_free_i32(tcg_ctx_00,pTVar9);
      tcg_temp_free_i32(tcg_ctx_00,pTVar8);
      reg = (uVar5 + 1) * (1 << sVar12);
    }
  }
  if (reg_01 != 0xf) {
    pTVar8 = load_reg(s,reg_00);
    if (reg_01 == 0xd) {
      tcg_gen_addi_i32_aarch64(tcg_ctx_00,pTVar8,pTVar8,reg);
    }
    else {
      pTVar9 = load_reg(s,reg_01);
      tcg_gen_add_i32(tcg_ctx_00,pTVar8,pTVar8,pTVar9);
      tcg_temp_free_i32(tcg_ctx_00,pTVar9);
    }
    store_reg(s,reg_00,pTVar8);
  }
  return 0;
}

Assistant:

static int disas_neon_ls_insn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd, rn, rm;
    int op;
    int nregs;
    int interleave;
    int spacing;
    int stride;
    int size;
    int reg;
    int load;
    int n;
    int vec_size;
    int mmu_idx;
    MemOp endian;
    TCGv_i32 addr;
    TCGv_i32 tmp;
    TCGv_i32 tmp2;
    TCGv_i64 tmp64;

    /* FIXME: this access check should not take precedence over UNDEF
     * for invalid encodings; we will generate incorrect syndrome information
     * for attempts to execute invalid vfp/neon encodings with FP disabled.
     */
    if (s->fp_excp_el) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                           syn_simd_access_trap(1, 0xe, false), s->fp_excp_el);
        return 0;
    }

    if (!s->vfp_enabled)
      return 1;
    VFP_DREG_D(rd, insn);
    rn = (insn >> 16) & 0xf;
    rm = insn & 0xf;
    load = (insn & (1 << 21)) != 0;
    endian = s->be_data;
    mmu_idx = get_mem_index(s);
    if ((insn & (1 << 23)) == 0) {
        /* Load store all elements.  */
        op = (insn >> 8) & 0xf;
        size = (insn >> 6) & 3;
        if (op > 10)
            return 1;
        /* Catch UNDEF cases for bad values of align field */
        switch (op & 0xc) {
        case 4:
            if (((insn >> 5) & 1) == 1) {
                return 1;
            }
            break;
        case 8:
            if (((insn >> 4) & 3) == 3) {
                return 1;
            }
            break;
        default:
            break;
        }
        nregs = neon_ls_element_type[op].nregs;
        interleave = neon_ls_element_type[op].interleave;
        spacing = neon_ls_element_type[op].spacing;
        if (size == 3 && (interleave | spacing) != 1) {
            return 1;
        }
        /* For our purposes, bytes are always little-endian.  */
        if (size == 0) {
            endian = MO_LE;
        }
        /* Consecutive little-endian elements from a single register
         * can be promoted to a larger little-endian operation.
         */
        if (interleave == 1 && endian == MO_LE) {
            size = 3;
        }
        tmp64 = tcg_temp_new_i64(tcg_ctx);
        addr = tcg_temp_new_i32(tcg_ctx);
        tmp2 = tcg_const_i32(tcg_ctx, 1 << size);
        load_reg_var(s, addr, rn);
        for (reg = 0; reg < nregs; reg++) {
            for (n = 0; n < 8 >> size; n++) {
                int xs;
                for (xs = 0; xs < interleave; xs++) {
                    int tt = rd + reg + spacing * xs;

                    if (load) {
                        gen_aa32_ld_i64(s, tmp64, addr, mmu_idx, endian | size);
                        neon_store_element64(tcg_ctx, tt, n, size, tmp64);
                    } else {
                        neon_load_element64(tcg_ctx, tmp64, tt, n, size);
                        gen_aa32_st_i64(s, tmp64, addr, mmu_idx, endian | size);
                    }
                    tcg_gen_add_i32(tcg_ctx, addr, addr, tmp2);
                }
            }
        }
        tcg_temp_free_i32(tcg_ctx, addr);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        tcg_temp_free_i64(tcg_ctx, tmp64);
        stride = nregs * interleave * 8;
    } else {
        size = (insn >> 10) & 3;
        if (size == 3) {
            /* Load single element to all lanes.  */
            int a = (insn >> 4) & 1;
            if (!load) {
                return 1;
            }
            size = (insn >> 6) & 3;
            nregs = ((insn >> 8) & 3) + 1;

            if (size == 3) {
                if (nregs != 4 || a == 0) {
                    return 1;
                }
                /* For VLD4 size==3 a == 1 means 32 bits at 16 byte alignment */
                size = 2;
            }
            if (nregs == 1 && a == 1 && size == 0) {
                return 1;
            }
            if (nregs == 3 && a == 1) {
                return 1;
            }
            addr = tcg_temp_new_i32(tcg_ctx);
            load_reg_var(s, addr, rn);

            /* VLD1 to all lanes: bit 5 indicates how many Dregs to write.
             * VLD2/3/4 to all lanes: bit 5 indicates register stride.
             */
            stride = (insn & (1 << 5)) ? 2 : 1;
            vec_size = nregs == 1 ? stride * 8 : 8;

            tmp = tcg_temp_new_i32(tcg_ctx);
            for (reg = 0; reg < nregs; reg++) {
                gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                                s->be_data | size);
                if ((rd & 1) && vec_size == 16) {
                    /* We cannot write 16 bytes at once because the
                     * destination is unaligned.
                     */
                    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(rd, 0),
                                         8, 8, tmp);
                    tcg_gen_gvec_mov(tcg_ctx, 0, neon_reg_offset(rd + 1, 0),
                                     neon_reg_offset(rd, 0), 8, 8);
                } else {
                    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(rd, 0),
                                         vec_size, vec_size, tmp);
                }
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 1 << size);
                rd += stride;
            }
            tcg_temp_free_i32(tcg_ctx, tmp);
            tcg_temp_free_i32(tcg_ctx, addr);
            stride = (1 << size) * nregs;
        } else {
            /* Single element.  */
            int idx = (insn >> 4) & 0xf;
            int reg_idx;
            switch (size) {
            case 0:
                reg_idx = (insn >> 5) & 7;
                stride = 1;
                break;
            case 1:
                reg_idx = (insn >> 6) & 3;
                stride = (insn & (1 << 5)) ? 2 : 1;
                break;
            case 2:
                reg_idx = (insn >> 7) & 1;
                stride = (insn & (1 << 6)) ? 2 : 1;
                break;
            default:
                abort();
            }
            nregs = ((insn >> 8) & 3) + 1;
            /* Catch the UNDEF cases. This is unavoidably a bit messy. */
            switch (nregs) {
            case 1:
                if (((idx & (1 << size)) != 0) ||
                    (size == 2 && ((idx & 3) == 1 || (idx & 3) == 2))) {
                    return 1;
                }
                break;
            case 3:
                if ((idx & 1) != 0) {
                    return 1;
                }
                /* fall through */
            case 2:
                if (size == 2 && (idx & 2) != 0) {
                    return 1;
                }
                break;
            case 4:
                if ((size == 2) && ((idx & 3) == 3)) {
                    return 1;
                }
                break;
            default:
                abort();
            }
            if ((rd + stride * (nregs - 1)) > 31) {
                /* Attempts to write off the end of the register file
                 * are UNPREDICTABLE; we choose to UNDEF because otherwise
                 * the neon_load_reg() would write off the end of the array.
                 */
                return 1;
            }
            tmp = tcg_temp_new_i32(tcg_ctx);
            addr = tcg_temp_new_i32(tcg_ctx);
            load_reg_var(s, addr, rn);
            for (reg = 0; reg < nregs; reg++) {
                if (load) {
                    gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                                    s->be_data | size);
                    neon_store_element(tcg_ctx, rd, reg_idx, size, tmp);
                } else { /* Store */
                    neon_load_element(tcg_ctx, tmp, rd, reg_idx, size);
                    gen_aa32_st_i32(s, tmp, addr, get_mem_index(s),
                                    s->be_data | size);
                }
                rd += stride;
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 1 << size);
            }
            tcg_temp_free_i32(tcg_ctx, addr);
            tcg_temp_free_i32(tcg_ctx, tmp);
            stride = nregs * (1 << size);
        }
    }
    if (rm != 15) {
        TCGv_i32 base;

        base = load_reg(s, rn);
        if (rm == 13) {
            tcg_gen_addi_i32(tcg_ctx, base, base, stride);
        } else {
            TCGv_i32 index;
            index = load_reg(s, rm);
            tcg_gen_add_i32(tcg_ctx, base, base, index);
            tcg_temp_free_i32(tcg_ctx, index);
        }
        store_reg(s, rn, base);
    }
    return 0;
}